

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bipart.cpp
# Opt level: O2

Dist * Omega_h::bi_partition(Dist *__return_storage_ptr__,CommPtr *comm,Read<signed_char> *marks)

{
  Alloc *pAVar1;
  uint uVar2;
  I32 IVar3;
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  long total;
  long offset;
  LO LVar6;
  ulong uVar7;
  bool bVar8;
  allocator local_1d1;
  ulong local_1d0;
  LO local_1c4;
  undefined8 local_1c0;
  LOs marked;
  Remotes dests;
  int local_184;
  Write<int> dest_idxs;
  Write<int> dest_ranks;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_150;
  Write<int> local_140;
  Write<int> local_130;
  Write<int> local_120;
  Write<int> local_110;
  Write<signed_char> local_100;
  Write<int> local_f0;
  Write<int> local_e0;
  Read<long> globals;
  Remotes local_c0;
  Write<int> local_a0;
  Write<int> local_90;
  Write<int> local_80;
  Write<int> local_70;
  Omega_h local_60 [16];
  Write<int> local_50;
  Write<signed_char> local_40;
  
  uVar2 = Comm::size((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if ((uVar2 & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"ERROR: ");
    poVar5 = std::operator<<(poVar5,
                             "To use bi_partiion, please run with an even number of MPI ranks.");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  uVar2 = Comm::size((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if ((uVar2 & 1) == 0) {
    IVar3 = Comm::size((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    iVar4 = divide_no_remainder<int>(IVar3,2);
    local_1c0 = CONCAT44(extraout_var,iVar4);
    pAVar1 = (marks->write_).shared_alloc_.alloc;
    if (((ulong)pAVar1 & 1) == 0) {
      LVar6 = (LO)pAVar1->size;
    }
    else {
      LVar6 = (LO)((ulong)pAVar1 >> 3);
    }
    std::__cxx11::string::string((string *)&dests,"",(allocator *)&dest_idxs);
    Write<int>::Write(&dest_ranks,LVar6,(string *)&dests);
    std::__cxx11::string::~string((string *)&dests);
    pAVar1 = (marks->write_).shared_alloc_.alloc;
    if (((ulong)pAVar1 & 1) == 0) {
      LVar6 = (LO)pAVar1->size;
    }
    else {
      LVar6 = (LO)((ulong)pAVar1 >> 3);
    }
    std::__cxx11::string::string((string *)&dests,"",(allocator *)&marked);
    Write<int>::Write(&dest_idxs,LVar6,(string *)&dests);
    std::__cxx11::string::~string((string *)&dests);
    local_1d0 = 0;
    local_1c4 = -1;
    local_184 = 2;
    while( true ) {
      bVar8 = local_184 == 0;
      local_184 = local_184 + -1;
      if (bVar8) break;
      Write<signed_char>::Write(&local_100,&marks->write_);
      invert_marks((Omega_h *)&dests,(Read<signed_char> *)&local_100);
      Write<signed_char>::operator=(&marks->write_,(Write<signed_char> *)&dests);
      Write<signed_char>::~Write((Write<signed_char> *)&dests);
      Write<signed_char>::~Write(&local_100);
      Write<signed_char>::Write(&local_40,&marks->write_);
      collect_marked((Omega_h *)&marked,(Read<signed_char> *)&local_40);
      Write<signed_char>::~Write(&local_40);
      if (((ulong)marked.write_.shared_alloc_.alloc & 1) == 0) {
        uVar7 = (marked.write_.shared_alloc_.alloc)->size;
      }
      else {
        uVar7 = (ulong)marked.write_.shared_alloc_.alloc >> 3;
      }
      total = Comm::allreduce<long>
                        ((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,(long)(int)(uVar7 >> 2),OMEGA_H_SUM);
      if (((ulong)marked.write_.shared_alloc_.alloc & 1) == 0) {
        uVar7 = (marked.write_.shared_alloc_.alloc)->size;
      }
      else {
        uVar7 = (ulong)marked.write_.shared_alloc_.alloc >> 3;
      }
      offset = Comm::exscan<long>((comm->
                                  super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr,(long)(int)(uVar7 >> 2),OMEGA_H_SUM);
      if (((ulong)marked.write_.shared_alloc_.alloc & 1) == 0) {
        uVar7 = (marked.write_.shared_alloc_.alloc)->size;
      }
      else {
        uVar7 = (ulong)marked.write_.shared_alloc_.alloc >> 3;
      }
      std::__cxx11::string::string((string *)&dests,"",&local_1d1);
      Read<long>::Read(&globals,(LO)(uVar7 >> 2),offset,1,(string *)&dests);
      std::__cxx11::string::~string((string *)&dests);
      Write<long>::Write(&local_50,(Write<int> *)&globals);
      globals_to_linear_owners(&dests,(Read<long> *)&local_50,total,(I32)local_1c0);
      Write<long>::~Write((Write<long> *)&local_50);
      Write<int>::Write(&local_70,(Write<int> *)&dests);
      add_to_each<int>(local_60,(Read<int> *)&local_70,(int)local_1d0);
      Write<int>::Write(&local_80,&marked.write_);
      Write<int>::Write(&local_90,&dest_ranks);
      map_into<int>((Read<int> *)local_60,(LOs *)&local_80,&local_90,1);
      Write<int>::~Write(&local_90);
      Write<int>::~Write(&local_80);
      Write<int>::~Write((Write<int> *)local_60);
      Write<int>::~Write(&local_70);
      Write<int>::Write(&local_e0,&dests.idxs.write_);
      Write<int>::Write(&local_f0,&marked.write_);
      Write<int>::Write(&local_a0,&dest_idxs);
      map_into<int>((Read<int> *)&local_e0,(LOs *)&local_f0,&local_a0,1);
      Write<int>::~Write(&local_a0);
      Write<int>::~Write(&local_f0);
      Write<int>::~Write(&local_e0);
      IVar3 = Comm::rank((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
      if (IVar3 < (int)local_1d0) {
        uVar2 = (int)local_1d0 + (int)local_1c0;
      }
      else {
        IVar3 = Comm::rank((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr);
        uVar2 = (int)local_1d0 + (int)local_1c0;
        if (IVar3 < (int)uVar2) {
          IVar3 = Comm::rank((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
          local_1c4 = linear_partition_size(total,(I32)local_1c0,IVar3 - (int)local_1d0);
        }
      }
      Remotes::~Remotes(&dests);
      Write<long>::~Write(&globals.write_);
      Write<int>::~Write(&marked.write_);
      local_1d0 = (ulong)uVar2;
    }
    Write<int>::Write(&local_120,&dest_ranks);
    Read<int>::Read((Read<signed_char> *)&local_110,&local_120);
    Write<int>::Write(&local_140,&dest_idxs);
    Read<int>::Read((Read<signed_char> *)&local_130,&local_140);
    Remotes::Remotes(&dests,(Read<int> *)&local_110,(LOs *)&local_130);
    Write<int>::~Write(&local_130);
    Write<int>::~Write(&local_140);
    Write<int>::~Write(&local_110);
    Write<int>::~Write(&local_120);
    std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_150,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
    Remotes::Remotes(&local_c0,&dests);
    Dist::Dist(__return_storage_ptr__,(CommPtr *)&local_150,&local_c0,local_1c4);
    Remotes::~Remotes(&local_c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150._M_refcount);
    Remotes::~Remotes(&dests);
    Write<int>::~Write(&dest_idxs);
    Write<int>::~Write(&dest_ranks);
    return __return_storage_ptr__;
  }
  fail("assertion %s failed at %s +%d\n","comm->size() % 2 == 0",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_bipart.cpp"
       ,10);
}

Assistant:

Dist bi_partition(CommPtr comm, Read<I8> marks) {
  OMEGA_H_CHECK_MSG(comm->size() % 2 == 0, "To use bi_partiion, please run with an even number of MPI ranks.");
  auto halfsize = divide_no_remainder(comm->size(), 2);
  Write<I32> dest_ranks(marks.size());
  Write<LO> dest_idxs(marks.size());
  LO linsize = -1;
  I32 rank_start = 0;
  for (Int half = 0; half < 2; ++half) {
    marks = invert_marks(marks);
    auto marked = collect_marked(marks);
    auto total = comm->allreduce(GO(marked.size()), OMEGA_H_SUM);
    auto start = comm->exscan(GO(marked.size()), OMEGA_H_SUM);
    Read<GO> globals(marked.size(), start, 1);
    auto owners = globals_to_linear_owners(globals, total, halfsize);
    map_into(add_to_each(owners.ranks, rank_start), marked, dest_ranks, 1);
    map_into(owners.idxs, marked, dest_idxs, 1);
    if (rank_start <= comm->rank() && comm->rank() < (rank_start + halfsize)) {
      linsize =
          linear_partition_size(total, halfsize, comm->rank() - rank_start);
    }
    rank_start += halfsize;
  }
  auto dests = Remotes(Read<I32>(dest_ranks), Read<LO>(dest_idxs));
  return Dist(comm, dests, linsize);
}